

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

size_t __thiscall gui::MenuBar::findMenuIndex(MenuBar *this,String *name)

{
  bool bVar1;
  size_type sVar2;
  out_of_range *this_00;
  long in_RDI;
  size_t i;
  String *in_stack_ffffffffffffffb8;
  String *in_stack_ffffffffffffffc0;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::size
                      ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)(in_RDI + 0x2e0));
    if (sVar2 <= local_18) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"MenuBar::findMenuIndex");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::operator[]
              ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)(in_RDI + 0x2e0),local_18);
    bVar1 = sf::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (bVar1) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

size_t MenuBar::findMenuIndex(const sf::String& name) const {
    for (size_t i = 0; i < menus_.size(); ++i) {
        if (menus_[i].name == name) {
            return i;
        }
    }
    throw std::out_of_range("MenuBar::findMenuIndex");
}